

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O0

void __thiscall QAbstractItemViewPrivate::updateDirtyRegion(QAbstractItemViewPrivate *this)

{
  QRegion *in_RDI;
  long in_FS_OFFSET;
  QRegion *in_stack_ffffffffffffffc8;
  QWidget *in_stack_ffffffffffffffe0;
  QRegion *this_00;
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicTimer::stop();
  QWidget::update(in_stack_ffffffffffffffe0,in_RDI + 0x87);
  this_00 = &local_10;
  QRegion::QRegion(this_00);
  QRegion::operator=(in_RDI,in_stack_ffffffffffffffc8);
  QRegion::~QRegion(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void updateDirtyRegion() {
        updateTimer.stop();
        viewport->update(updateRegion);
        updateRegion = QRegion();
    }